

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian
          (BayesianProbitRegressor_Gaussian *this,BayesianProbitRegressor_Gaussian *from)

{
  BayesianProbitRegressor_Gaussian *from_local;
  BayesianProbitRegressor_Gaussian *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_Gaussian_006fb870;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->mean_,&from->mean_,0x10);
  return;
}

Assistant:

BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(const BayesianProbitRegressor_Gaussian& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&mean_, &from.mean_,
    static_cast<size_t>(reinterpret_cast<char*>(&precision_) -
    reinterpret_cast<char*>(&mean_)) + sizeof(precision_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.Gaussian)
}